

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printBlock(JSPrinter *this,Ref node)

{
  size_t sVar1;
  Ref *pRVar2;
  Ref local_18;
  Ref node_local;
  
  local_18.inst = node.inst;
  sVar1 = cashew::Value::size(node.inst);
  if (sVar1 != 1) {
    pRVar2 = Ref::operator[](&local_18,1);
    sVar1 = cashew::Value::size(pRVar2->inst);
    if (sVar1 != 0) {
      emit(this,'{');
      this->indent = this->indent + 1;
      newline(this);
      pRVar2 = Ref::operator[](&local_18,1);
      printStats(this,pRVar2->inst);
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      return;
    }
  }
  emit(this,"{}");
  return;
}

Assistant:

void printBlock(Ref node) {
    if (node->size() == 1 || node[1]->size() == 0) {
      emit("{}");
      return;
    }
    emit('{');
    indent++;
    newline();
    printStats(node[1]);
    indent--;
    newline();
    emit('}');
  }